

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,EnumValidityFunc *is_valid)

{
  ExtensionInfo info_00;
  LogMessage *other;
  undefined1 local_90 [8];
  ExtensionInfo info;
  LogMessage local_58;
  EnumValidityFuncWithArg *local_20;
  EnumValidityFunc *is_valid_local;
  bool is_packed_local;
  bool is_repeated_local;
  FieldType type_local;
  MessageLite *pMStack_10;
  int number_local;
  MessageLite *containing_type_local;
  
  local_20 = (EnumValidityFuncWithArg *)is_valid;
  is_valid_local._1_1_ = is_packed;
  is_valid_local._2_1_ = is_repeated;
  is_valid_local._3_1_ = type;
  is_valid_local._4_4_ = number;
  pMStack_10 = containing_type;
  if (type != '\x0e') {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
               ,0x8b);
    other = LogMessage::operator<<
                      (&local_58,"CHECK failed: (type) == (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=((LogFinisher *)((long)&info.descriptor + 3),other);
    LogMessage::~LogMessage(&local_58);
  }
  ExtensionInfo::ExtensionInfo
            ((ExtensionInfo *)local_90,is_valid_local._3_1_,(bool)(is_valid_local._2_1_ & 1),
             (bool)(is_valid_local._1_1_ & 1));
  info._0_8_ = CallNoArgValidityFunc;
  info.field_3.enum_validity_check.func = local_20;
  info_00.field_3.enum_validity_check.func = CallNoArgValidityFunc;
  info_00.type = local_90[0];
  info_00.is_repeated = (bool)local_90[1];
  info_00.is_packed = (bool)local_90[2];
  info_00._3_5_ = local_90._3_5_;
  info_00.field_3.enum_validity_check.arg = local_20;
  info_00.descriptor = (FieldDescriptor *)info.field_3.enum_validity_check.arg;
  anon_unknown_0::Register(pMStack_10,is_valid_local._4_4_,info_00);
  return;
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* containing_type,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         EnumValidityFunc* is_valid) {
  GOOGLE_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.enum_validity_check.func = CallNoArgValidityFunc;
  // See comment in CallNoArgValidityFunc() about why we use a c-style cast.
  info.enum_validity_check.arg = (void*)is_valid;
  Register(containing_type, number, info);
}